

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
BoundedFunctionData::Copy(BoundedFunctionData *this)

{
  int32_t iVar1;
  tuple<BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_> in_RAX;
  pointer pBVar2;
  pointer *__ptr;
  long in_RSI;
  __uniq_ptr_impl<BoundedFunctionData,_std::default_delete<BoundedFunctionData>_> local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
  super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl =
       (tuple<BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>)
       (tuple<BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>)
       in_RAX.
       super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
       super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl;
  duckdb::make_uniq<BoundedFunctionData>();
  iVar1 = *(int32_t *)(in_RSI + 8);
  pBVar2 = duckdb::unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>::
           operator->((unique_ptr<BoundedFunctionData,_std::default_delete<BoundedFunctionData>,_true>
                       *)&local_28);
  pBVar2->max_val = iVar1;
  *(tuple<BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_> *)this =
       local_28._M_t.
       super__Tuple_impl<0UL,_BoundedFunctionData_*,_std::default_delete<BoundedFunctionData>_>.
       super__Head_base<0UL,_BoundedFunctionData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		auto copy = make_uniq<BoundedFunctionData>();
		copy->max_val = max_val;
		return std::move(copy);
	}